

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.hpp
# Opt level: O2

uint64_t __thiscall bit_stream::get_int(bit_stream *this,size_t bits)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  
  if (bits != 0) {
    puVar1 = this->last_ptr;
    puVar4 = this->cur_ptr;
    if (puVar4 == puVar1 + 1) {
      puVar2 = this->of;
      puVar4 = this->first_ptr;
      this->cur_ptr = puVar4;
      this->of = puVar2 + 1;
      *puVar4 = *puVar2;
      this->bytes_consumed = this->bytes_consumed + 4;
    }
    if ((puVar4 == puVar1) || (0x20 < this->in_word_offset + bits)) {
      puVar4 = this->of;
      this->of = puVar4 + 1;
      *puVar1 = *puVar4;
      this->bytes_consumed = this->bytes_consumed + 4;
    }
    uVar3 = ::bits::read_int(&this->cur_ptr,&this->in_word_offset,(uint8_t)bits);
    if ((this->cur_ptr == this->last_ptr) && (this->in_word_offset != '\0')) {
      this->cur_ptr = this->first_ptr;
      *this->first_ptr = *this->last_ptr;
    }
    return (ulong)uVar3;
  }
  return 0;
}

Assistant:

uint64_t get_int(size_t bits)
    {
        if (bits == 0)
            return 0;
        if (cur_ptr == last_ptr + 1) {
            cur_ptr = first_ptr;
            *first_ptr = *of++;
            bytes_consumed += sizeof(uint32_t);
        }
        if (cur_ptr == last_ptr || (size_t(in_word_offset) + bits > 32)) {
            *last_ptr = *of++;
            bytes_consumed += sizeof(uint32_t);
        }
        uint32_t x = bits::read_int(cur_ptr, in_word_offset, bits);
        if (cur_ptr == last_ptr && in_word_offset != 0) {
            cur_ptr = first_ptr;
            *first_ptr = *last_ptr;
        }
        return x;
    }